

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void dfct(int n,double *a,double *t,int *ip,double *w)

{
  double *c;
  double dVar1;
  bool bVar2;
  uint nc;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  uint n_00;
  ulong uVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  iVar13 = *ip;
  if (iVar13 * 8 < n) {
    iVar13 = n >> 3;
    makewt(iVar13,ip,w);
  }
  uVar4 = n >> 1;
  nc = ip[1];
  if (ip[1] * 2 < n) {
    makect(uVar4,ip,w + iVar13);
    nc = uVar4;
  }
  dVar15 = a[(int)uVar4];
  dVar17 = *a + a[n];
  *a = *a - a[n];
  *t = dVar17 - dVar15;
  t[(int)uVar4] = dVar17 + dVar15;
  if (n < 3) {
    a[1] = *a;
    a[2] = *t;
    dVar15 = t[1];
  }
  else {
    n_00 = uVar4 >> 1;
    uVar8 = (ulong)uVar4;
    uVar12 = (ulong)(uint)n;
    uVar3 = (ulong)n_00;
    if (3 < uVar4) {
      lVar5 = 1;
      lVar7 = -uVar8;
      lVar6 = uVar8 * 8 + -8;
      lVar11 = 0;
      do {
        lVar7 = lVar7 + 1;
        dVar15 = *(double *)((long)a + lVar11 + uVar12 * 8 + -8);
        dVar14 = a[lVar5] + dVar15;
        dVar17 = *(double *)((long)a + lVar11 + lVar6);
        dVar1 = a[uVar12 + lVar7];
        dVar16 = dVar17 + dVar1;
        a[lVar5] = a[lVar5] - dVar15;
        *(double *)((long)a + lVar11 + lVar6) = dVar17 - dVar1;
        t[lVar5] = dVar14 - dVar16;
        *(double *)((long)t + lVar11 + uVar8 * 8 + -8) = dVar16 + dVar14;
        lVar5 = lVar5 + 1;
        lVar11 = lVar11 + -8;
      } while (uVar3 * 8 + -8 + lVar11 != 0);
    }
    t[uVar3] = a[uVar3] + a[(int)(n - n_00)];
    a[uVar3] = a[uVar3] - a[(int)(n - n_00)];
    c = w + iVar13;
    dctsub(uVar4,a,nc,c);
    if ((int)uVar4 < 5) {
      if (uVar4 == 4) {
        cftfsub(4,a,w);
      }
    }
    else {
      bitrv2(uVar4,ip + 2,a);
      cftfsub(uVar4,a,w);
      rftfsub(uVar4,a,nc,c);
    }
    a[uVar12 - 1] = *a - a[1];
    a[1] = *a + a[1];
    if (3 < (int)uVar4) {
      lVar7 = uVar8 + 2;
      lVar6 = uVar8 << 3;
      do {
        dVar15 = a[lVar7 + -4];
        *(double *)((long)a + lVar6 * 2 + -0x18) = a[lVar7 + -3] + dVar15;
        *(double *)((long)a + lVar6 * 2 + -0x28) = dVar15 - a[lVar7 + -3];
        lVar7 = lVar7 + -2;
        lVar6 = lVar6 + -0x10;
      } while (5 < lVar7);
    }
    lVar7 = 2;
    if (3 < uVar4) {
      iVar13 = 2;
      do {
        dctsub(n_00,t,nc,c);
        if (n_00 < 5) {
          if (n_00 == 4) {
            cftfsub(4,t,w);
          }
        }
        else {
          bitrv2(n_00,ip + 2,t);
          cftfsub(n_00,t,w);
          rftfsub(n_00,t,nc,c);
        }
        a[n - iVar13] = *t - t[1];
        lVar7 = (long)iVar13;
        a[lVar7] = *t + t[1];
        uVar3 = (ulong)n_00;
        if (2 < n_00) {
          uVar8 = 2;
          lVar6 = (long)(iVar13 * 4);
          do {
            a[lVar6 - lVar7] = t[uVar8] - t[uVar8 + 1];
            a[lVar7 + lVar6] = t[uVar8] + t[uVar8 + 1];
            uVar8 = uVar8 + 2;
            lVar6 = lVar6 + iVar13 * 4;
          } while (uVar8 < uVar3);
        }
        uVar4 = n_00 >> 1;
        uVar8 = (ulong)uVar4;
        pdVar9 = t;
        pdVar10 = t;
        if (1 < n_00) {
          do {
            dVar15 = pdVar10[uVar3];
            *pdVar10 = pdVar9[uVar3 * 2] - dVar15;
            pdVar9[uVar3] = dVar15 + pdVar9[uVar3 * 2];
            uVar8 = uVar8 - 1;
            pdVar9 = pdVar9 + -1;
            pdVar10 = pdVar10 + 1;
          } while (uVar8 != 0);
        }
        iVar13 = iVar13 * 2;
        t[uVar4] = t[uVar4 + n_00];
        bVar2 = 3 < n_00;
        n_00 = uVar4;
      } while (bVar2);
      lVar7 = (long)iVar13;
    }
    a[lVar7] = *t;
    a[n] = t[2] - t[1];
    dVar15 = t[2] + t[1];
  }
  *a = dVar15;
  return;
}

Assistant:

void dfct(int n, double *a, double *t, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void makect(int nc, int *ip, double *c);
    void bitrv2(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void rftfsub(int n, double *a, int nc, double *c);
    void dctsub(int n, double *a, int nc, double *c);
    int j, k, l, m, mh, nw, nc;
    double xr, xi, yr, yi;
    
    nw = ip[0];
    if (n > (nw << 3)) {
        nw = n >> 3;
        makewt(nw, ip, w);
    }
    nc = ip[1];
    if (n > (nc << 1)) {
        nc = n >> 1;
        makect(nc, ip, w + nw);
    }
    m = n >> 1;
    yi = a[m];
    xi = a[0] + a[n];
    a[0] -= a[n];
    t[0] = xi - yi;
    t[m] = xi + yi;
    if (n > 2) {
        mh = m >> 1;
        for (j = 1; j < mh; j++) {
            k = m - j;
            xr = a[j] - a[n - j];
            xi = a[j] + a[n - j];
            yr = a[k] - a[n - k];
            yi = a[k] + a[n - k];
            a[j] = xr;
            a[k] = yr;
            t[j] = xi - yi;
            t[k] = xi + yi;
        }
        t[mh] = a[mh] + a[n - mh];
        a[mh] -= a[n - mh];
        dctsub(m, a, nc, w + nw);
        if (m > 4) {
            bitrv2(m, ip + 2, a);
            cftfsub(m, a, w);
            rftfsub(m, a, nc, w + nw);
        } else if (m == 4) {
            cftfsub(m, a, w);
        }
        a[n - 1] = a[0] - a[1];
        a[1] = a[0] + a[1];
        for (j = m - 2; j >= 2; j -= 2) {
            a[2 * j + 1] = a[j] + a[j + 1];
            a[2 * j - 1] = a[j] - a[j + 1];
        }
        l = 2;
        m = mh;
        while (m >= 2) {
            dctsub(m, t, nc, w + nw);
            if (m > 4) {
                bitrv2(m, ip + 2, t);
                cftfsub(m, t, w);
                rftfsub(m, t, nc, w + nw);
            } else if (m == 4) {
                cftfsub(m, t, w);
            }
            a[n - l] = t[0] - t[1];
            a[l] = t[0] + t[1];
            k = 0;
            for (j = 2; j < m; j += 2) {
                k += l << 2;
                a[k - l] = t[j] - t[j + 1];
                a[k + l] = t[j] + t[j + 1];
            }
            l <<= 1;
            mh = m >> 1;
            for (j = 0; j < mh; j++) {
                k = m - j;
                t[j] = t[m + k] - t[m + j];
                t[k] = t[m + k] + t[m + j];
            }
            t[mh] = t[m + mh];
            m = mh;
        }
        a[l] = t[0];
        a[n] = t[2] - t[1];
        a[0] = t[2] + t[1];
    } else {
        a[1] = a[0];
        a[2] = t[0];
        a[0] = t[1];
    }
}